

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

IVec4 __thiscall
tcu::anon_unknown_3::getTriangleAABB
          (anon_unknown_3 *this,SceneTriangle *triangle,IVec2 *viewportSize)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  IVec4 IVar8;
  Vector<float,_2> local_b8;
  Vector<float,_2> local_b0;
  Vector<float,_2> local_a8;
  Vector<float,_2> local_a0;
  Vector<float,_2> local_98;
  Vector<float,_2> local_90;
  Vector<float,_2> local_88;
  Vector<float,_2> local_80;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  Vector<float,_2> local_58;
  Vec2 screenSpace [3];
  Vector<float,_2> local_38;
  Vec2 normalizedDeviceSpace [3];
  IVec2 *viewportSize_local;
  SceneTriangle *triangle_local;
  IVec4 *aabb;
  
  normalizedDeviceSpace[2].m_data = (float  [2])viewportSize;
  fVar4 = Vector<float,_4>::x(triangle->positions);
  fVar5 = Vector<float,_4>::w(triangle->positions);
  fVar6 = Vector<float,_4>::y(triangle->positions);
  fVar7 = Vector<float,_4>::w(triangle->positions);
  Vector<float,_2>::Vector(&local_38,fVar4 / fVar5,fVar6 / fVar7);
  fVar4 = Vector<float,_4>::x(triangle->positions + 1);
  fVar5 = Vector<float,_4>::w(triangle->positions + 1);
  fVar6 = Vector<float,_4>::y(triangle->positions + 1);
  fVar7 = Vector<float,_4>::w(triangle->positions + 1);
  Vector<float,_2>::Vector(normalizedDeviceSpace,fVar4 / fVar5,fVar6 / fVar7);
  fVar4 = Vector<float,_4>::x(triangle->positions + 2);
  fVar5 = Vector<float,_4>::w(triangle->positions + 2);
  fVar6 = Vector<float,_4>::y(triangle->positions + 2);
  fVar7 = Vector<float,_4>::w(triangle->positions + 2);
  Vector<float,_2>::Vector(normalizedDeviceSpace + 1,fVar4 / fVar5,fVar6 / fVar7);
  Vector<float,_2>::Vector(&local_70,1.0,1.0);
  tcu::operator+((tcu *)&local_68,&local_38,&local_70);
  tcu::operator*((tcu *)&local_60,&local_68,0.5);
  iVar1 = Vector<int,_2>::x((Vector<int,_2> *)normalizedDeviceSpace[2].m_data);
  iVar2 = Vector<int,_2>::y((Vector<int,_2> *)normalizedDeviceSpace[2].m_data);
  Vector<float,_2>::Vector(&local_78,(float)iVar1,(float)iVar2);
  tcu::operator*((tcu *)&local_58,&local_60,&local_78);
  Vector<float,_2>::Vector(&local_90,1.0,1.0);
  tcu::operator+((tcu *)&local_88,normalizedDeviceSpace,&local_90);
  tcu::operator*((tcu *)&local_80,&local_88,0.5);
  iVar1 = Vector<int,_2>::x((Vector<int,_2> *)normalizedDeviceSpace[2].m_data);
  iVar2 = Vector<int,_2>::y((Vector<int,_2> *)normalizedDeviceSpace[2].m_data);
  Vector<float,_2>::Vector(&local_98,(float)iVar1,(float)iVar2);
  tcu::operator*((tcu *)screenSpace,&local_80,&local_98);
  Vector<float,_2>::Vector(&local_b0,1.0,1.0);
  tcu::operator+((tcu *)&local_a8,normalizedDeviceSpace + 1,&local_b0);
  tcu::operator*((tcu *)&local_a0,&local_a8,0.5);
  iVar1 = Vector<int,_2>::x((Vector<int,_2> *)normalizedDeviceSpace[2].m_data);
  iVar2 = Vector<int,_2>::y((Vector<int,_2> *)normalizedDeviceSpace[2].m_data);
  Vector<float,_2>::Vector(&local_b8,(float)iVar1,(float)iVar2);
  tcu::operator*((tcu *)(screenSpace + 1),&local_a0,&local_b8);
  Vector<int,_4>::Vector((Vector<int,_4> *)this);
  fVar4 = Vector<float,_2>::x(&local_58);
  fVar5 = Vector<float,_2>::x(screenSpace);
  fVar4 = de::min<float>(fVar4,fVar5);
  fVar5 = Vector<float,_2>::x(screenSpace + 1);
  fVar4 = de::min<float>(fVar4,fVar5);
  fVar4 = ::deFloatFloor(fVar4);
  piVar3 = Vector<int,_4>::x((Vector<int,_4> *)this);
  *piVar3 = (int)fVar4;
  fVar4 = Vector<float,_2>::y(&local_58);
  fVar5 = Vector<float,_2>::y(screenSpace);
  fVar4 = de::min<float>(fVar4,fVar5);
  fVar5 = Vector<float,_2>::y(screenSpace + 1);
  fVar4 = de::min<float>(fVar4,fVar5);
  fVar4 = ::deFloatFloor(fVar4);
  piVar3 = Vector<int,_4>::y((Vector<int,_4> *)this);
  *piVar3 = (int)fVar4;
  fVar4 = Vector<float,_2>::x(&local_58);
  fVar5 = Vector<float,_2>::x(screenSpace);
  fVar4 = de::max<float>(fVar4,fVar5);
  fVar5 = Vector<float,_2>::x(screenSpace + 1);
  fVar4 = de::max<float>(fVar4,fVar5);
  fVar4 = ::deFloatCeil(fVar4);
  piVar3 = Vector<int,_4>::z((Vector<int,_4> *)this);
  *piVar3 = (int)fVar4;
  fVar4 = Vector<float,_2>::y(&local_58);
  fVar5 = Vector<float,_2>::y(screenSpace);
  fVar4 = de::max<float>(fVar4,fVar5);
  fVar5 = Vector<float,_2>::y(screenSpace + 1);
  fVar4 = de::max<float>(fVar4,fVar5);
  fVar4 = ::deFloatCeil(fVar4);
  piVar3 = Vector<int,_4>::w((Vector<int,_4> *)this);
  *piVar3 = (int)fVar4;
  IVar8.m_data[2] = (int)fVar4;
  IVar8.m_data._0_8_ = this;
  IVar8.m_data[3] = 0;
  return (IVec4)IVar8.m_data;
}

Assistant:

tcu::IVec4 getTriangleAABB (const TriangleSceneSpec::SceneTriangle& triangle, const tcu::IVec2& viewportSize)
{
	const tcu::Vec2 normalizedDeviceSpace[3] =
	{
		tcu::Vec2(triangle.positions[0].x() / triangle.positions[0].w(), triangle.positions[0].y() / triangle.positions[0].w()),
		tcu::Vec2(triangle.positions[1].x() / triangle.positions[1].w(), triangle.positions[1].y() / triangle.positions[1].w()),
		tcu::Vec2(triangle.positions[2].x() / triangle.positions[2].w(), triangle.positions[2].y() / triangle.positions[2].w()),
	};
	const tcu::Vec2 screenSpace[3] =
	{
		(normalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(normalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(normalizedDeviceSpace[2] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
	};

	tcu::IVec4 aabb;

	aabb.x() = (int)deFloatFloor(de::min(de::min(screenSpace[0].x(), screenSpace[1].x()), screenSpace[2].x()));
	aabb.y() = (int)deFloatFloor(de::min(de::min(screenSpace[0].y(), screenSpace[1].y()), screenSpace[2].y()));
	aabb.z() = (int)deFloatCeil (de::max(de::max(screenSpace[0].x(), screenSpace[1].x()), screenSpace[2].x()));
	aabb.w() = (int)deFloatCeil (de::max(de::max(screenSpace[0].y(), screenSpace[1].y()), screenSpace[2].y()));

	return aabb;
}